

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

vec3 vera::hue2rgb(float _hue)

{
  float fVar1;
  float fVar2;
  float fVar3;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar4;
  vec3 vVar5;
  
  fVar1 = _hue * 6.0;
  fVar2 = fmodf(fVar1,6.0);
  fVar2 = ABS(fVar2 + -3.0) + -1.0;
  if (1.0 <= fVar2) {
    fVar2 = 1.0;
  }
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  fVar3 = fmodf(fVar1 + 4.0,6.0);
  fVar3 = ABS(fVar3 + -3.0) + -1.0;
  if (1.0 <= fVar3) {
    fVar3 = 1.0;
  }
  if (fVar3 <= 0.0) {
    fVar3 = 0.0;
  }
  fVar1 = fmodf(fVar1 + 2.0,6.0);
  aVar4.z = ABS(fVar1 + -3.0) + -1.0;
  if (1.0 <= aVar4.z) {
    aVar4.z = 1.0;
  }
  if (aVar4.z <= 0.0) {
    aVar4.z = 0.0;
  }
  vVar5.field_1.y = fVar3;
  vVar5.field_0.x = fVar2;
  vVar5.field_2.z = aVar4.z;
  return vVar5;
}

Assistant:

glm::vec3 hue2rgb(float _hue) {
    float r = saturate( abs( fmod( _hue * 6.f, 6.f) - 3.f) - 1.f );
    float g = saturate( abs( fmod( _hue * 6.f + 4.f, 6.f) - 3.f) - 1.f );
    float b = saturate( abs( fmod( _hue * 6.f + 2.f, 6.f) - 3.f) - 1.f );

    #ifdef HSV2RGB_SMOOTH
    r = r*r*(3. - 2. * r);
    g = g*g*(3. - 2. * g);
    b = b*b*(3. - 2. * b);
    #endif

    return glm::vec3(r, g, b);
}